

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O3

void __thiscall
HighsCliqueTable::extractCliquesFromCut
          (HighsCliqueTable *this,HighsMipSolver *mipsolver,HighsInt *inds,double *vals,HighsInt len
          ,double rhs)

{
  HighsDomain *this_00;
  int *__args;
  HighsVarType HVar1;
  HighsMipSolverData *pHVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  HighsInt *pHVar6;
  pointer piVar7;
  HighsInt HVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  HighsInt j;
  int *piVar15;
  int iVar16;
  uint uVar17;
  iterator j_1;
  int *piVar18;
  double dVar19;
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  pointer piVar23;
  undefined8 uVar25;
  undefined1 auVar24 [16];
  pointer piVar26;
  undefined1 auVar27 [16];
  HighsDomainChange boundchg;
  vector<int,_std::allocator<int>_> perm;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> clique;
  ulong local_130;
  int local_124;
  HighsMipSolver *local_120;
  HighsInt *local_118;
  pointer local_110;
  vector<int,_std::allocator<int>_> local_108;
  double local_e8;
  pointer local_e0;
  double local_d8;
  HighsInt local_cc;
  double local_c8;
  undefined8 uStack_c0;
  HighsCliqueTable *local_b8;
  double local_b0;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> local_a8;
  double local_88;
  undefined8 uStack_80;
  ulong local_70;
  HighsImplications *local_68;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_60;
  ulong local_58;
  long local_50;
  double local_48;
  double local_40;
  double *local_38;
  
  if ((this->numEntries < this->maxEntries) && (len != 0)) {
    pHVar2 = (mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    local_68 = &pHVar2->implications;
    this_00 = &pHVar2->domain;
    local_b0 = pHVar2->feastol;
    uVar10 = 0;
    iVar16 = 0;
    uVar25 = 0;
    local_d8 = 0.0;
    dVar19 = 0.0;
    do {
      lVar11 = (long)inds[uVar10];
      if (((*(char *)(*(long *)&(((pHVar2->domain).mipsolver)->model_->integrality_).
                                super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                                _M_impl + lVar11) != '\0') &&
          (dVar21 = *(double *)
                     (*(long *)&(pHVar2->domain).col_lower_.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl +
                     lVar11 * 8), dVar21 == 0.0)) && (!NAN(dVar21))) {
        iVar16 = iVar16 + (uint)(*(double *)
                                  (*(long *)&(pHVar2->domain).col_upper_.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl + lVar11 * 8) == 1.0);
      }
      if (vals[uVar10] <= 0.0) {
        dVar21 = *(double *)
                  (*(long *)&(pHVar2->domain).col_upper_.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl +
                  lVar11 * 8);
        if (INFINITY <= dVar21) {
          return;
        }
      }
      else {
        dVar21 = *(double *)
                  (*(long *)&(pHVar2->domain).col_lower_.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl +
                  lVar11 * 8);
        if (dVar21 <= -INFINITY) {
          return;
        }
      }
      dVar21 = vals[uVar10] * dVar21;
      dVar22 = dVar19 + dVar21;
      local_d8 = local_d8 + (dVar19 - (dVar22 - dVar21)) + (dVar21 - (dVar22 - (dVar22 - dVar21)));
      uVar10 = uVar10 + 1;
      dVar19 = dVar22;
    } while ((uint)len != uVar10);
    local_120 = mipsolver;
    local_118 = inds;
    local_e8 = rhs;
    local_b8 = this;
    local_38 = vals;
    if (len != 0) {
      local_110 = (pointer)(rhs - dVar22);
      local_e0 = (pointer)(((rhs - (dVar22 + (double)local_110)) +
                           (-dVar22 - ((double)local_110 - (dVar22 + (double)local_110)))) -
                          local_d8);
      uVar10 = 0;
      local_88 = dVar22;
      uStack_80 = uVar25;
      do {
        if ((local_120->model_->integrality_).
            super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_start[local_118[uVar10]] != kContinuous) {
          local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = local_110;
          local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_e0;
          HighsCDouble::operator/=((HighsCDouble *)&local_108,vals[uVar10]);
          pHVar6 = local_118;
          if (vals[uVar10] <= 0.0) {
            local_c8 = (double)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start +
                       (double)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish +
                       *(double *)
                        (*(long *)&(pHVar2->domain).col_upper_.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl +
                        (long)local_118[uVar10] * 8);
            dVar19 = HighsDomain::feastol(this_00);
            dVar19 = ceil(local_c8 - dVar19);
            uVar13 = (ulong)(uint)pHVar6[uVar10];
          }
          else {
            local_c8 = (double)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start +
                       (double)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish +
                       *(double *)
                        (*(long *)&(pHVar2->domain).col_lower_.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl +
                        (long)local_118[uVar10] * 8);
            dVar19 = HighsDomain::feastol(this_00);
            dVar19 = floor(dVar19 + local_c8);
            uVar13 = (ulong)(uint)pHVar6[uVar10] + 0x100000000;
          }
          boundchg.column = (int)uVar13;
          boundchg.boundtype = (int)(uVar13 >> 0x20);
          boundchg.boundval = dVar19;
          HighsDomain::changeBound(this_00,boundchg,(Reason)0xfffffffe);
          dVar22 = local_88;
          uVar25 = uStack_80;
          if ((pHVar2->domain).infeasible_ != false) {
            return;
          }
        }
        uVar10 = uVar10 + 1;
      } while ((uint)len != uVar10);
    }
    if (1 < iVar16) {
      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_88 = dVar22;
      uStack_80 = uVar25;
      std::vector<int,_std::allocator<int>_>::resize(&local_108,(long)len);
      auVar5 = _DAT_003bf640;
      auVar4 = _DAT_003beea0;
      auVar3 = _DAT_003bee90;
      local_60._M_current =
           local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
      if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        uVar10 = (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish +
                 (-4 - (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
        auVar27._8_4_ = (int)uVar10;
        auVar27._0_8_ = uVar10;
        auVar27._12_4_ = (int)(uVar10 >> 0x20);
        auVar20._0_8_ = uVar10 >> 2;
        auVar20._8_8_ = auVar27._8_8_ >> 2;
        uVar13 = 0;
        auVar20 = auVar20 ^ _DAT_003beea0;
        do {
          iVar12 = (int)uVar13;
          auVar24._8_4_ = iVar12;
          auVar24._0_8_ = uVar13;
          auVar24._12_4_ = (int)(uVar13 >> 0x20);
          auVar27 = (auVar24 | auVar3) ^ auVar4;
          iVar16 = auVar20._4_4_;
          if ((bool)(~(auVar27._4_4_ == iVar16 && auVar20._0_4_ < auVar27._0_4_ ||
                      iVar16 < auVar27._4_4_) & 1)) {
            local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar13] = iVar12;
          }
          if ((auVar27._12_4_ != auVar20._12_4_ || auVar27._8_4_ <= auVar20._8_4_) &&
              auVar27._12_4_ <= auVar20._12_4_) {
            local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar13 + 1] = iVar12 + 1;
          }
          auVar27 = (auVar24 | auVar5) ^ auVar4;
          iVar9 = auVar27._4_4_;
          if (iVar9 <= iVar16 && (iVar9 != iVar16 || auVar27._0_4_ <= auVar20._0_4_)) {
            local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar13 + 2] = iVar12 + 2;
            local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar13 + 3] = iVar12 + 3;
          }
          uVar13 = uVar13 + 4;
        } while (((uVar10 >> 2) + 4 & 0xfffffffffffffffc) != uVar13);
        lVar11 = *(long *)&(((pHVar2->domain).mipsolver)->model_->integrality_).
                           super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl;
        piVar15 = local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar18 = local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        do {
          while( true ) {
            local_60._M_current = piVar15;
            iVar16 = *local_60._M_current;
            lVar14 = (long)local_118[iVar16];
            if (((*(char *)(lVar11 + lVar14) == '\0') ||
                (dVar19 = *(double *)
                           (*(long *)&(pHVar2->domain).col_lower_.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl +
                           lVar14 * 8), dVar19 != 0.0)) ||
               ((NAN(dVar19) ||
                ((dVar19 = *(double *)
                            (*(long *)&(pHVar2->domain).col_upper_.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl +
                            lVar14 * 8), dVar19 != 1.0 || (NAN(dVar19))))))) break;
            local_60._M_current = local_60._M_current + 1;
            piVar15 = local_60._M_current;
            if (local_60._M_current == piVar18) goto LAB_0025fa2f;
          }
          do {
            piVar18 = piVar18 + -1;
            if (local_60._M_current == piVar18) goto LAB_0025fa2f;
            lVar14 = (long)local_118[*piVar18];
          } while ((((*(char *)(lVar11 + lVar14) == '\0') ||
                    (dVar19 = *(double *)
                               (*(long *)&(pHVar2->domain).col_lower_.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl + lVar14 * 8), dVar19 != 0.0)) || (NAN(dVar19)))
                  || ((dVar19 = *(double *)
                                 (*(long *)&(pHVar2->domain).col_upper_.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl + lVar14 * 8), dVar19 != 1.0 || (NAN(dVar19)))))
          ;
          *local_60._M_current = *piVar18;
          *piVar18 = iVar16;
          piVar15 = local_60._M_current + 1;
        } while (piVar18 != local_60._M_current + 1);
        local_60._M_current = local_60._M_current + 1;
      }
LAB_0025fa2f:
      local_70 = (long)local_60._M_current -
                 (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
      if ((int)local_70 != 0 && (int)local_70 < len) {
        local_40 = local_e8 - local_88;
        local_48 = ((local_e8 - (local_88 + local_40)) +
                   (-local_88 - (local_40 - (local_88 + local_40)))) - local_d8;
        iVar16 = (int)((ulong)((long)local_60._M_current -
                              (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2);
        local_50 = (long)iVar16;
        local_58 = local_70 & 0xffffffff;
        uVar10 = 0;
        do {
          local_cc = local_118[local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar10]];
          local_110 = (pointer)(local_40 -
                               ABS(vals[local_108.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start[uVar10]]));
          local_c8 = ((double)((ulong)vals[local_108.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start[uVar10]] |
                              0x8000000000000000) - ((double)local_110 - local_40)) +
                     (local_40 - ((double)local_110 - ((double)local_110 - local_40))) + local_48;
          uStack_c0 = 0x8000000000000000;
          lVar11 = local_50;
          iVar12 = len - iVar16;
          do {
            piVar7 = local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar9 = local_118[local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar11]];
            lVar14 = (long)iVar9;
            piVar23 = *(pointer *)
                       (*(long *)&(pHVar2->domain).col_lower_.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl +
                       lVar14 * 8);
            piVar26 = *(pointer *)
                       (*(long *)&(pHVar2->domain).col_upper_.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl +
                       lVar14 * 8);
            if (((double)piVar23 != (double)piVar26) ||
               (NAN((double)piVar23) || NAN((double)piVar26))) {
              dVar19 = vals[local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar11]];
              HVar1 = (local_120->model_->integrality_).
                      super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar14];
              if (dVar19 <= 0.0) {
                dVar21 = (double)local_110 + (double)piVar26 * dVar19;
                piVar26 = (pointer)((((double)piVar26 * dVar19 - (dVar21 - (double)local_110)) +
                                     ((double)local_110 - (dVar21 - (dVar21 - (double)local_110))) +
                                     local_c8 + dVar21) / dVar19);
                if (HVar1 != kContinuous) {
                  local_e0 = piVar23;
                  piVar26 = (pointer)ceil((double)piVar26 -
                                          ((local_120->mipdata_)._M_t.
                                           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                           .super__Head_base<0UL,_HighsMipSolverData_*,_false>.
                                          _M_head_impl)->feastol);
                  piVar23 = local_e0;
                }
                if (local_b0 + (double)piVar23 < (double)piVar26) {
                  if (0.0 < vals[piVar7[uVar10]] || vals[piVar7[uVar10]] == 0.0) {
                    if ((double)piVar23 <= -INFINITY) goto LAB_0025fb7d;
                    dVar19 = (double)piVar26 - (double)piVar23;
                  }
                  else {
                    dVar19 = (double)piVar23 - (double)piVar26;
                    piVar23 = piVar26;
                  }
                  HighsImplications::addVLB(local_68,iVar9,local_cc,dVar19,(double)piVar23);
                }
              }
              else {
                dVar21 = (double)local_110 + (double)piVar23 * dVar19;
                piVar23 = (pointer)((((double)piVar23 * dVar19 - (dVar21 - (double)local_110)) +
                                     ((double)local_110 - (dVar21 - (dVar21 - (double)local_110))) +
                                     local_c8 + dVar21) / dVar19);
                if (HVar1 != kContinuous) {
                  local_e0 = piVar26;
                  piVar23 = (pointer)floor((double)piVar23 +
                                           ((local_120->mipdata_)._M_t.
                                            super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                            .super__Head_base<0UL,_HighsMipSolverData_*,_false>.
                                           _M_head_impl)->feastol);
                  piVar26 = local_e0;
                }
                if ((double)piVar23 < (double)piVar26 - local_b0) {
                  if (0.0 < vals[piVar7[uVar10]] || vals[piVar7[uVar10]] == 0.0) {
                    if (INFINITY <= (double)piVar26) goto LAB_0025fb7d;
                    dVar19 = (double)piVar23 - (double)piVar26;
                  }
                  else {
                    dVar19 = (double)piVar26 - (double)piVar23;
                    piVar26 = piVar23;
                  }
                  HighsImplications::addVUB(local_68,iVar9,local_cc,dVar19,(double)piVar26);
                }
              }
            }
LAB_0025fb7d:
            lVar11 = lVar11 + 1;
            iVar12 = iVar12 + -1;
          } while (iVar12 != 0);
          uVar10 = uVar10 + 1;
        } while (uVar10 != local_58);
      }
      uVar17 = (uint)local_70;
      if (1 < (int)uVar17) {
        local_a8.
        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
        ._M_impl.super__Vector_impl_data._M_start = (CliqueVar *)0x0;
        local_a8.
        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
        ._M_impl.super__Vector_impl_data._M_finish = (CliqueVar *)0x0;
        local_a8.
        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        reserve(&local_a8,(ulong)(uVar17 & 0x7fffffff));
        if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != local_60._M_current) {
          uVar10 = (long)local_60._M_current -
                   (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2;
          iVar16 = 0;
          if (1 < uVar10) {
            iVar16 = 0;
            do {
              uVar10 = (long)uVar10 >> 1;
              iVar16 = iVar16 + 1;
            } while (1 < uVar10);
          }
          pdqsort_detail::
          pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractCliquesFromCut(HighsMipSolver_const&,int_const*,double_const*,int,double)::__1,false>
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                     local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,local_60,(anon_class_8_1_8992ca70)&local_38,
                     iVar16,true);
          vals = local_38;
        }
        local_110 = (pointer)(local_e8 - local_88);
        local_e8 = ((local_e8 - (local_88 + (double)local_110)) +
                   (-local_88 - ((double)local_110 - (local_88 + (double)local_110)))) - local_d8;
        dVar19 = local_b0 + (double)local_110;
        if ((local_b0 - (dVar19 - (double)local_110)) +
            ((double)local_110 - (dVar19 - (dVar19 - (double)local_110))) + local_e8 + dVar19 <
            ABS(vals[local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[1]]) +
            ABS(vals[*local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start])) {
          iVar16 = ((local_120->mipdata_)._M_t.
                    super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                    .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                   numCliqueEntriesAfterPresolve;
          HVar8 = HighsSparseMatrix::numNz(&((pHVar2->domain).mipsolver)->model_->a_matrix_);
          pHVar6 = local_118;
          iVar9 = iVar16 + HVar8 * 4 + 100000;
          iVar12 = local_b8->numEntries;
          iVar16 = iVar12 + uVar17 * 10;
          if (iVar9 <= iVar16) {
            iVar16 = iVar9;
          }
          local_c8 = (double)CONCAT44(local_c8._4_4_,iVar16);
          if ((uVar17 - 1 != 0) && (iVar12 < iVar9)) {
            local_130 = (ulong)(uVar17 - 1);
            piVar18 = local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            do {
              dVar19 = (double)local_110 - ABS(vals[piVar18[local_130]]);
              dVar21 = local_b0 + dVar19;
              uVar10 = local_130;
              piVar15 = piVar18;
              do {
                uVar13 = uVar10 >> 1;
                if ((local_b0 - (dVar21 - dVar19)) + (dVar19 - (dVar21 - (dVar21 - dVar19))) +
                    ((double)((ulong)vals[piVar18[local_130]] | (ulong)DAT_003be0d0) -
                    (dVar19 - (double)local_110)) +
                    ((double)local_110 - (dVar19 - (dVar19 - (double)local_110))) + local_e8 +
                    dVar21 < ABS(vals[piVar15[uVar13]])) {
                  piVar15 = piVar15 + uVar13 + 1;
                  uVar13 = ~uVar13 + uVar10;
                }
                uVar10 = uVar13;
              } while (0 < (long)uVar13);
              if (piVar15 != piVar18) {
                if (local_a8.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    local_a8.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  local_a8.
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
                       local_a8.
                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                }
                do {
                  __args = pHVar6 + *piVar18;
                  if (0.0 < vals[*piVar18] || vals[*piVar18] == 0.0) {
                    local_124 = 1;
                    std::
                    vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                    ::emplace_back<int_const&,int>
                              ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                                *)&local_a8,__args,&local_124);
                  }
                  else {
                    local_124 = 0;
                    std::
                    vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                    ::emplace_back<int_const&,int>
                              ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                                *)&local_a8,__args,&local_124);
                  }
                  piVar18 = piVar18 + 1;
                } while (piVar18 != piVar15);
                piVar18 = pHVar6 + local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[local_130];
                if (0.0 < vals[local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[local_130]] ||
                    vals[local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[local_130]] == 0.0) {
                  local_124 = 1;
                  std::
                  vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
                  emplace_back<int_const&,int>
                            ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                              *)&local_a8,piVar18,&local_124);
                }
                else {
                  local_124 = 0;
                  std::
                  vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
                  emplace_back<int_const&,int>
                            ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                              *)&local_a8,piVar18,&local_124);
                }
                uVar10 = (long)local_a8.
                               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_a8.
                               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 2;
                if (uVar10 < 2) {
                  if (piVar15 ==
                      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + local_130) break;
                  iVar12 = local_b8->numEntries;
                  piVar18 = local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                }
                else {
                  addClique(local_b8,local_120,
                            local_a8.
                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            ._M_impl.super__Vector_impl_data._M_start,(HighsInt)uVar10,false,
                            0x7fffffff);
                  if ((pHVar2->domain).infeasible_ != false) break;
                  iVar12 = local_b8->numEntries;
                  if ((local_c8._0_4_ <= iVar12) ||
                     (piVar18 = local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                     piVar15 ==
                     local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + local_130)) break;
                }
              }
              local_130 = local_130 - 1;
              if (((int)local_130 == 0) || (local_c8._0_4_ <= iVar12)) break;
            } while( true );
          }
        }
        if (local_a8.
            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
            ._M_impl.super__Vector_impl_data._M_start != (CliqueVar *)0x0) {
          operator_delete(local_a8.
                          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
  }
  return;
}

Assistant:

void HighsCliqueTable::extractCliquesFromCut(const HighsMipSolver& mipsolver,
                                             const HighsInt* inds,
                                             const double* vals, HighsInt len,
                                             double rhs) {
  if (isFull()) return;

  HighsImplications& implics = mipsolver.mipdata_->implications;
  HighsDomain& globaldom = mipsolver.mipdata_->domain;

  const double feastol = mipsolver.mipdata_->feastol;

  HighsCDouble minact = 0.0;
  HighsInt nbin = 0;
  for (HighsInt i = 0; i != len; ++i) {
    if (globaldom.isBinary(inds[i])) ++nbin;

    if (vals[i] > 0) {
      if (globaldom.col_lower_[inds[i]] == -kHighsInf) return;
      minact += vals[i] * globaldom.col_lower_[inds[i]];
    } else {
      if (globaldom.col_upper_[inds[i]] == kHighsInf) return;
      minact += vals[i] * globaldom.col_upper_[inds[i]];
    }
  }

  for (HighsInt i = 0; i != len; ++i) {
    if (mipsolver.variableType(inds[i]) == HighsVarType::kContinuous) continue;

    double boundVal = double((rhs - minact) / vals[i]);
    if (vals[i] > 0) {
      boundVal = std::floor(boundVal + globaldom.col_lower_[inds[i]] +
                            globaldom.feastol());
      globaldom.changeBound(HighsBoundType::kUpper, inds[i], boundVal,
                            HighsDomain::Reason::unspecified());
      if (globaldom.infeasible()) return;
    } else {
      boundVal = std::ceil(boundVal + globaldom.col_upper_[inds[i]] -
                           globaldom.feastol());
      globaldom.changeBound(HighsBoundType::kLower, inds[i], boundVal,
                            HighsDomain::Reason::unspecified());
      if (globaldom.infeasible()) return;
    }
  }

  if (nbin <= 1) return;

  std::vector<HighsInt> perm;
  perm.resize(len);
  std::iota(perm.begin(), perm.end(), 0);

  auto binaryend = std::partition(perm.begin(), perm.end(), [&](HighsInt pos) {
    return globaldom.isBinary(inds[pos]);
  });

  nbin = binaryend - perm.begin();

  // if not all variables are binary, we extract variable upper and lower bounds
  // constraints on the non-binary variable for each binary variable in the
  // constraint:
  if (nbin < len) {
    for (HighsInt i = 0; i != nbin; ++i) {
      HighsInt bincol = inds[perm[i]];
      HighsCDouble impliedActivity = rhs - minact - std::abs(vals[perm[i]]);
      for (HighsInt j = nbin; j != len; ++j) {
        HighsInt col = inds[perm[j]];
        if (globaldom.isFixed(col)) continue;

        if (vals[perm[j]] > 0) {
          double implcolub = double(impliedActivity +
                                    vals[perm[j]] * globaldom.col_lower_[col]) /
                             vals[perm[j]];
          if (mipsolver.variableType(col) != HighsVarType::kContinuous)
            implcolub = std::floor(implcolub + mipsolver.mipdata_->feastol);

          if (implcolub < globaldom.col_upper_[col] - feastol) {
            double coef;
            double constant;
            if (vals[perm[i]] < 0) {
              coef = globaldom.col_upper_[col] - implcolub;
              constant = implcolub;
            } else {
              // make sure that upper bound is not infinite to avoid adding VUB
              // with coefficient '-kHighsInf' and constant 'kHighsInf'
              if (globaldom.col_upper_[col] == kHighsInf) continue;
              coef = implcolub - globaldom.col_upper_[col];
              constant = globaldom.col_upper_[col];
            }
            // printf("extracted VUB from cut: x%" HIGHSINT_FORMAT " <= %g*y%"
            // HIGHSINT_FORMAT " + %g\n", col, coef,
            //        bincol, constant);
            implics.addVUB(col, bincol, coef, constant);
          }
        } else {
          double implcollb = double(impliedActivity +
                                    vals[perm[j]] * globaldom.col_upper_[col]) /
                             vals[perm[j]];
          if (mipsolver.variableType(col) != HighsVarType::kContinuous)
            implcollb = std::ceil(implcollb - mipsolver.mipdata_->feastol);

          if (implcollb > globaldom.col_lower_[col] + feastol) {
            double coef;
            double constant;
            if (vals[perm[i]] < 0) {
              coef = globaldom.col_lower_[col] - implcollb;
              constant = implcollb;
            } else {
              // make sure that lower bound is not infinite to avoid adding VLB
              // with coefficient 'kHighsInf' and constant '-kHighsInf'
              if (globaldom.col_lower_[col] == -kHighsInf) continue;
              coef = implcollb - globaldom.col_lower_[col];
              constant = globaldom.col_lower_[col];
            }

            // printf("extracted VLB from cut: x%" HIGHSINT_FORMAT " >= %g*y%"
            // HIGHSINT_FORMAT " + %g\n", col, coef,
            //        bincol, constant);
            implics.addVLB(col, bincol, coef, constant);
            // printf("extracted VLB from cut\n");
          }
        }
      }
    }
  }

  // only one binary means we do have no cliques
  if (nbin <= 1) return;

  std::vector<CliqueVar> clique;
  clique.reserve(nbin);

  pdqsort(perm.begin(), binaryend, [&](HighsInt p1, HighsInt p2) {
    return std::make_pair(std::abs(vals[p1]), p1) >
           std::make_pair(std::abs(vals[p2]), p2);
  });
  // check if any cliques exists
  if (std::abs(vals[perm[0]]) + std::abs(vals[perm[1]]) <=
      double(rhs - minact + feastol))
    return;

  HighsInt maxNewEntries =
      std::min(mipsolver.mipdata_->numCliqueEntriesAfterPresolve + 100000 +
                   4 * globaldom.numModelNonzeros(),
               numEntries + 10 * nbin);

  for (HighsInt k = nbin - 1; k != 0 && numEntries < maxNewEntries; --k) {
    double mincliqueval =
        double(rhs - minact - std::abs(vals[perm[k]]) + feastol);
    auto cliqueend = std::partition_point(
        perm.begin(), perm.begin() + k,
        [&](HighsInt p) { return std::abs(vals[p]) > mincliqueval; });

    // no clique for this variable
    if (cliqueend == perm.begin()) continue;

    clique.clear();

    for (auto j = perm.begin(); j != cliqueend; ++j) {
      HighsInt pos = *j;
      if (vals[pos] < 0)
        clique.emplace_back(inds[pos], 0);
      else
        clique.emplace_back(inds[pos], 1);
    }

    if (vals[perm[k]] < 0)
      clique.emplace_back(inds[perm[k]], 0);
    else
      clique.emplace_back(inds[perm[k]], 1);

    // printf("extracted this clique:\n");
    // printClique(clique);
    if (clique.size() >= 2) {
      // printf("extracted clique from cut\n");
      // if (clique.size() > 2) runCliqueSubsumption(globaldom, clique);

      addClique(mipsolver, clique.data(), clique.size());
      if (globaldom.infeasible() || numEntries >= maxNewEntries) return;
    }

    // further cliques are just subsets of this clique
    if (cliqueend == perm.begin() + k) return;
  }
}